

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::SplitWeakDictionary
          (SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
           *this,Recycler *allocator,int capacity)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  (this->super_IWeakReferenceDictionary)._vptr_IWeakReferenceDictionary =
       (_func_int **)&PTR_Cleanup_0152c980;
  (this->buckets).ptr = (int *)0x0;
  (this->entries).ptr = (ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> *)0x0;
  (this->weakRefs).ptr = (RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *)0x0;
  this->alloc = allocator;
  this->size = 0;
  this->bucketCount = 0;
  this->count = 0;
  this->freeList = 0;
  this->freeCount = 0;
  this->modFunctionIndex = 0x4b;
  if (allocator == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                       ,0x91,"(allocator)","allocator");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (0 < capacity) {
    Initialize(this,capacity);
    return;
  }
  return;
}

Assistant:

SplitWeakDictionary(Recycler* allocator, int capacity = 0)
            : buckets(nullptr),
            entries(nullptr),
            weakRefs(nullptr),
            alloc(allocator),
            size(0),
            bucketCount(0),
            count(0),
            freeList(0),
            freeCount(0),
            modFunctionIndex(UNKNOWN_MOD_INDEX)
        {
            Assert(allocator);
            Assert(reinterpret_cast<void*>(this) == reinterpret_cast<void*>((IWeakReferenceDictionary*)this));

            // If initial capacity is negative or 0, lazy initialization on
            // the first insert operation is performed.
            if (capacity > 0)
            {
                Initialize(capacity);
            }
        }